

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O0

void WOPN_parseInstrument
               (WOPNInstrument *ins,uint8_t *cursor,uint16_t version,uint8_t has_sounding_delays)

{
  int16_t iVar1;
  uint16_t uVar2;
  long lVar3;
  size_t off;
  int l;
  uint8_t has_sounding_delays_local;
  uint16_t version_local;
  uint8_t *cursor_local;
  WOPNInstrument *ins_local;
  
  strncpy(ins->inst_name,(char *)cursor,0x20);
  ins->inst_name[0x1f] = '\0';
  iVar1 = toSint16BE(cursor + 0x20);
  ins->note_offset = iVar1;
  ins->midi_velocity_offset = '\0';
  ins->percussion_key_number = cursor[0x22];
  ins->inst_flags = '\0';
  ins->fbalg = cursor[0x23];
  ins->lfosens = cursor[0x24];
  for (off._0_4_ = 0; (int)off < 4; off._0_4_ = (int)off + 1) {
    lVar3 = (long)(int)off * 7;
    ins->operators[(int)off].dtfm_30 = cursor[lVar3 + 0x25];
    ins->operators[(int)off].level_40 = cursor[lVar3 + 0x26];
    ins->operators[(int)off].rsatk_50 = cursor[lVar3 + 0x27];
    ins->operators[(int)off].amdecay1_60 = cursor[lVar3 + 0x28];
    ins->operators[(int)off].decay2_70 = cursor[lVar3 + 0x29];
    ins->operators[(int)off].susrel_80 = cursor[lVar3 + 0x2a];
    ins->operators[(int)off].ssgeg_90 = cursor[lVar3 + 0x2b];
  }
  if ((1 < version) && (has_sounding_delays != '\0')) {
    uVar2 = toUint16BE(cursor + 0x41);
    ins->delay_on_ms = uVar2;
    uVar2 = toUint16BE(cursor + 0x43);
    ins->delay_off_ms = uVar2;
    if ((version < 3) && ((ins->delay_on_ms == 0 && (ins->delay_off_ms == 0)))) {
      ins->inst_flags = ins->inst_flags | 2;
    }
  }
  return;
}

Assistant:

static void WOPN_parseInstrument(WOPNInstrument *ins, uint8_t *cursor, uint16_t version, uint8_t has_sounding_delays)
{
    int l;
    strncpy(ins->inst_name, (const char*)cursor, 32);
    ins->inst_name[31] = '\0';
    ins->note_offset = toSint16BE(cursor + 32);
    ins->midi_velocity_offset = 0;  /* TODO: for future version > 2 */
    ins->percussion_key_number = cursor[34];
    ins->inst_flags = 0;  /* TODO: for future version > 2 */
    ins->fbalg = cursor[35];
    ins->lfosens = cursor[36];
    for(l = 0; l < 4; l++)
    {
        size_t off = 37 + (size_t)(l) * 7;
        ins->operators[l].dtfm_30     = cursor[off + 0];
        ins->operators[l].level_40    = cursor[off + 1];
        ins->operators[l].rsatk_50    = cursor[off + 2];
        ins->operators[l].amdecay1_60 = cursor[off + 3];
        ins->operators[l].decay2_70   = cursor[off + 4];
        ins->operators[l].susrel_80   = cursor[off + 5];
        ins->operators[l].ssgeg_90    = cursor[off + 6];
    }
    if((version >= 2) && has_sounding_delays)
    {
        ins->delay_on_ms  = toUint16BE(cursor + 65);
        ins->delay_off_ms = toUint16BE(cursor + 67);

        /* Null delays indicate the blank instrument in version 2 */
        if((version < 3) && ins->delay_on_ms == 0 && ins->delay_off_ms == 0)
            ins->inst_flags |= WOPN_Ins_IsBlank;
    }
}